

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

int Gia_ManSimSimulateEquiv(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Gia_Sim2_t *p;
  Vec_Int_t *pVVar10;
  Abc_Cex_t *pAVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int i;
  int iVar16;
  Gia_Man_t *pGVar17;
  Gia_Obj_t *pGVar18;
  ulong uVar19;
  uint *puVar20;
  long lVar21;
  Gia_ParSim_t *pPars_00;
  bool bVar22;
  double dVar23;
  timespec ts;
  int local_6c;
  timespec local_68;
  long local_58;
  uint local_4c;
  Gia_ParSim_t *local_48;
  double local_40;
  long local_38;
  
  iVar6 = clock_gettime(3,&local_68);
  if (iVar6 < 0) {
    lVar21 = -1;
  }
  else {
    lVar21 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar6 = pPars->TimeLimit;
  if ((long)iVar6 == 0) {
    local_38 = 0;
  }
  else {
    iVar7 = clock_gettime(3,&local_68);
    if (iVar7 < 0) {
      local_38 = -1;
    }
    else {
      local_38 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    local_38 = local_38 + (long)iVar6 * 1000000;
  }
  if ((pAig->pReprs == (Gia_Rpr_t *)0x0) || (pAig->pNexts == (int *)0x0)) {
    __assert_fail("pAig->pReprs && pAig->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                  ,0x285,"int Gia_ManSimSimulateEquiv(Gia_Man_t *, Gia_ParSim_t *)");
  }
  if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
    free(pAig->pCexSeq);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
  }
  p = Gia_Sim2Create(pAig,pPars);
  local_48 = pPars;
  Gia_ManResetRandom(pPars);
  pGVar17 = p->pAig;
  iVar6 = pGVar17->nRegs;
  if (0 < iVar6) {
    pVVar10 = pGVar17->vCis;
    iVar7 = 0;
    do {
      iVar16 = pVVar10->nSize;
      uVar12 = (iVar16 - iVar6) + iVar7;
      if (((int)uVar12 < 0) || (iVar16 <= (int)uVar12)) {
LAB_0071a351:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar10->pArray[uVar12];
      if (((long)iVar6 < 0) || (pGVar17->nObjs <= iVar6)) {
LAB_0071a332:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar17->pObjs == (Gia_Obj_t *)0x0) break;
      lVar14 = (long)p->nWords;
      if (0 < lVar14) {
        memset(p->pDataSim + (int)pGVar17->pObjs[iVar6].Value * lVar14,0,lVar14 << 2);
      }
      iVar7 = iVar7 + 1;
      iVar6 = pGVar17->nRegs;
    } while (iVar7 < iVar6);
  }
  if (local_48->nIters < 1) {
    iVar6 = 0;
    uVar12 = 0;
    pPars_00 = local_48;
  }
  else {
    local_40 = (double)lVar21;
    uVar9 = 0;
    local_58 = lVar21;
    do {
      uVar12 = uVar9;
      pGVar17 = p->pAig;
      uVar9 = pGVar17->pObjs->Value;
      pGVar18 = (Gia_Obj_t *)(ulong)uVar9;
      if (uVar9 != 0) {
        __assert_fail("Gia_ObjValue(pObj) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                      ,0x119,"void Gia_Sim2SimulateRound(Gia_Sim2_t *)");
      }
      if (0 < (long)p->nWords) {
        pGVar18 = (Gia_Obj_t *)p->pDataSim;
        memset(pGVar18,0,(long)p->nWords << 2);
      }
      pVVar10 = pGVar17->vCis;
      uVar13 = (ulong)(uint)pVVar10->nSize;
      if (pGVar17->nRegs < pVVar10->nSize) {
        lVar21 = 0;
        do {
          if ((int)uVar13 <= lVar21) goto LAB_0071a351;
          iVar6 = pVVar10->pArray[lVar21];
          if (((long)iVar6 < 0) || (pGVar17->nObjs <= iVar6)) goto LAB_0071a332;
          if (pGVar17->pObjs == (Gia_Obj_t *)0x0) break;
          iVar7 = p->nWords;
          if (0 < (long)iVar7) {
            uVar9 = pGVar17->pObjs[iVar6].Value;
            puVar20 = p->pDataSim;
            lVar14 = (long)iVar7 + 1;
            do {
              pGVar18 = (Gia_Obj_t *)0x0;
              uVar8 = Gia_ManRandom(0);
              puVar20[(long)(int)(uVar9 * iVar7) + lVar14 + -2] = uVar8;
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
          }
          lVar21 = lVar21 + 1;
          pGVar17 = p->pAig;
          pVVar10 = pGVar17->vCis;
          uVar13 = (ulong)pVVar10->nSize;
        } while (lVar21 < (long)(uVar13 - (long)pGVar17->nRegs));
      }
      pPars_00 = local_48;
      if ((0 < pGVar17->nObjs) && (pGVar3 = pGVar17->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
        uVar13 = 0;
        do {
          uVar19 = *(ulong *)(pGVar3 + uVar13);
          uVar9 = (uint)uVar19;
          bVar22 = (~uVar9 & 0x1fffffff) == 0;
          pGVar18 = (Gia_Obj_t *)(ulong)CONCAT31((int3)(~uVar9 >> 8),bVar22 || (int)uVar9 < 0);
          if (!bVar22 && (int)uVar9 >= 0) {
            uVar8 = pGVar3[uVar13].Value;
            if (uVar13 != uVar8) {
              __assert_fail("Gia_ObjValue(pObj) == i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim2.c"
                            ,0x11f,"void Gia_Sim2SimulateRound(Gia_Sim2_t *)");
            }
            puVar20 = p->pDataSim;
            uVar1 = p->nWords;
            uVar15 = (ulong)uVar1;
            iVar6 = uVar1 * uVar8;
            pGVar18 = (Gia_Obj_t *)(puVar20 + (int)((uVar8 - (uVar9 & 0x1fffffff)) * uVar1));
            iVar7 = (uVar8 - ((uint)(uVar19 >> 0x20) & 0x1fffffff)) * uVar1;
            if ((uVar9 >> 0x1d & 1) == 0) {
              if ((uVar19 >> 0x3d & 1) == 0) {
                if (0 < (int)uVar1) {
                  lVar21 = uVar15 + 1;
                  do {
                    puVar20[(long)iVar6 + lVar21 + -2] =
                         puVar20[(long)iVar7 + lVar21 + -2] &
                         *(uint *)((long)pGVar18 + (lVar21 + -2) * 4);
                    lVar21 = lVar21 + -1;
                  } while (1 < lVar21);
                }
              }
              else if (0 < (int)uVar1) {
                lVar21 = uVar15 + 1;
                do {
                  puVar20[(long)iVar6 + lVar21 + -2] =
                       ~puVar20[(long)iVar7 + lVar21 + -2] &
                       *(uint *)((long)pGVar18 + (lVar21 + -2) * 4);
                  lVar21 = lVar21 + -1;
                } while (1 < lVar21);
              }
            }
            else if ((uVar19 >> 0x3d & 1) == 0) {
              if (0 < (int)uVar1) {
                lVar21 = uVar15 + 1;
                do {
                  puVar20[(long)iVar6 + lVar21 + -2] =
                       ~*(uint *)((long)pGVar18 + (lVar21 + -2) * 4) &
                       puVar20[(long)iVar7 + lVar21 + -2];
                  lVar21 = lVar21 + -1;
                } while (1 < lVar21);
              }
            }
            else if (0 < (int)uVar1) {
              lVar21 = uVar15 + 1;
              do {
                puVar20[(long)iVar6 + lVar21 + -2] =
                     ~(puVar20[(long)iVar7 + lVar21 + -2] |
                      *(uint *)((long)pGVar18 + (lVar21 + -2) * 4));
                lVar21 = lVar21 + -1;
              } while (1 < lVar21);
            }
          }
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)pGVar17->nObjs);
      }
      pVVar10 = pGVar17->vCos;
      if (0 < pVVar10->nSize) {
        piVar4 = pVVar10->pArray;
        lVar21 = 0;
        do {
          lVar14 = (long)piVar4[lVar21];
          if ((lVar14 < 0) || (pGVar17->nObjs <= piVar4[lVar21])) goto LAB_0071a332;
          pGVar18 = pGVar17->pObjs;
          if (pGVar18 == (Gia_Obj_t *)0x0) break;
          pGVar3 = pGVar18 + lVar14;
          pGVar5 = pGVar18 + lVar14;
          puVar20 = p->pDataSim;
          uVar9 = p->nWords;
          pGVar18 = (Gia_Obj_t *)(puVar20 + (int)(uVar9 * pGVar5->Value));
          iVar6 = (pGVar5->Value - (*(uint *)pGVar3 & 0x1fffffff)) * uVar9;
          if ((*(uint *)pGVar3 >> 0x1d & 1) == 0) {
            if (0 < (int)uVar9) {
              lVar14 = (ulong)uVar9 + 1;
              do {
                *(uint *)((long)pGVar18 + (lVar14 + -2) * 4) = puVar20[(long)iVar6 + lVar14 + -2];
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
          }
          else if (0 < (int)uVar9) {
            lVar14 = (ulong)uVar9 + 1;
            do {
              *(uint *)((long)pGVar18 + (lVar14 + -2) * 4) = ~puVar20[(long)iVar6 + lVar14 + -2];
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < pVVar10->nSize);
      }
      if (local_48->fVerbose != 0) {
        Abc_Print((int)pGVar18,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(uVar12 + 1),
                  (ulong)(uint)local_48->nIters,(ulong)(uint)local_48->TimeLimit);
        if ((pAig->pReprs != (Gia_Rpr_t *)0x0) && (pAig->pNexts != (int *)0x0)) {
          pGVar17 = pAig;
          uVar9 = Gia_ManEquivCountLitsAll(pAig);
          Abc_Print((int)pGVar17,"Lits = %4d. ",(ulong)uVar9);
        }
        iVar7 = 3;
        iVar6 = clock_gettime(3,&local_68);
        dVar23 = -1.0;
        if (-1 < iVar6) {
          dVar23 = (double)(local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000);
        }
        Abc_Print(iVar7,"Time = %7.2f sec\r",(dVar23 - local_40) / 1000000.0);
      }
      if (pPars_00->fCheckMiter != 0) {
        pGVar17 = p->pAig;
        uVar9 = pGVar17->vCos->nSize;
        bVar22 = true;
        uVar8 = uVar9 - pGVar17->nRegs;
        if (uVar8 != 0 && pGVar17->nRegs <= (int)uVar9) {
          uVar13 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar13 = 0;
          }
          uVar19 = 0;
LAB_00719fbe:
          if (uVar19 == uVar13) goto LAB_0071a351;
          iVar6 = pGVar17->vCos->pArray[uVar19];
          if (((long)iVar6 < 0) || (pGVar17->nObjs <= iVar6)) goto LAB_0071a332;
          if (pGVar17->pObjs != (Gia_Obj_t *)0x0) {
            iVar7 = p->nWords;
            iVar16 = -1;
            if (0 < (long)iVar7) {
              puVar20 = p->pDataSim + (int)(pGVar17->pObjs[iVar6].Value * iVar7);
              lVar21 = 0;
              do {
                if (*puVar20 != 0) {
                  uVar9 = 0;
                  goto LAB_0071a036;
                }
                lVar21 = lVar21 + -0x20;
                puVar20 = puVar20 + 1;
              } while ((long)iVar7 * 0x20 + lVar21 != 0);
            }
            goto LAB_0071a04b;
          }
        }
LAB_0071a067:
        if (!bVar22) {
          Gia_ManResetRandom(pPars_00);
          uVar9 = local_4c;
          pPars_00->iOutFail = local_4c;
          pGVar17 = pAig;
          pAVar11 = Gia_Sim2GenerateCounter(pAig,uVar12,local_4c,p->nWords,local_6c);
          pAig->pCexSeq = pAVar11;
          Abc_Print((int)pGVar17,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                    (ulong)uVar9,pAig->pName,(ulong)uVar12);
          pGVar17 = pAig;
          iVar7 = Gia_ManVerifyCex(pAig,pAig->pCexSeq,0);
          iVar6 = 1;
          lVar21 = local_58;
          if (iVar7 == 0) {
            Abc_Print((int)pGVar17,"\nGenerated counter-example is INVALID.                    ");
            lVar21 = local_58;
          }
          goto LAB_0071a201;
        }
      }
      if ((pAig->pReprs != (Gia_Rpr_t *)0x0) && (pAig->pNexts != (int *)0x0)) {
        Gia_Sim2InfoRefineEquivs(p);
      }
      iVar6 = clock_gettime(3,&local_68);
      if (iVar6 < 0) {
        lVar21 = -1;
      }
      else {
        lVar21 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      if (local_38 < lVar21) break;
      if ((int)uVar12 < pPars_00->nIters + -1) {
        pGVar17 = p->pAig;
        iVar6 = pGVar17->nRegs;
        if (0 < iVar6) {
          pVVar10 = pGVar17->vCos;
          iVar7 = 0;
          do {
            iVar16 = pVVar10->nSize;
            uVar9 = (iVar16 - iVar6) + iVar7;
            if (((int)uVar9 < 0) || (iVar16 <= (int)uVar9)) goto LAB_0071a351;
            iVar16 = pVVar10->pArray[uVar9];
            if (((long)iVar16 < 0) || (pGVar17->nObjs <= iVar16)) goto LAB_0071a332;
            pGVar18 = pGVar17->pObjs;
            if (pGVar18 == (Gia_Obj_t *)0x0) break;
            iVar2 = pGVar17->vCis->nSize;
            uVar9 = (iVar2 - iVar6) + iVar7;
            if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) goto LAB_0071a351;
            iVar6 = pGVar17->vCis->pArray[uVar9];
            if (((long)iVar6 < 0) || (pGVar17->nObjs <= iVar6)) goto LAB_0071a332;
            iVar2 = p->nWords;
            if (0 < (long)iVar2) {
              puVar20 = p->pDataSim;
              uVar9 = pGVar18[iVar6].Value;
              uVar8 = pGVar18[iVar16].Value;
              lVar21 = (long)iVar2 + 1;
              do {
                puVar20[(long)(int)(uVar9 * iVar2) + lVar21 + -2] =
                     puVar20[(long)(int)(uVar8 * iVar2) + lVar21 + -2];
                lVar21 = lVar21 + -1;
              } while (1 < lVar21);
            }
            iVar7 = iVar7 + 1;
            iVar6 = pGVar17->nRegs;
          } while (iVar7 < iVar6);
        }
      }
      uVar9 = uVar12 + 1;
    } while ((int)(uVar12 + 1) < pPars_00->nIters);
    uVar12 = uVar12 + 1;
    iVar6 = 0;
    lVar21 = local_58;
  }
LAB_0071a201:
  Gia_Sim2Delete(p);
  if (pAig->pCexSeq == (Abc_Cex_t *)0x0) {
    Abc_Print((int)p,"No bug detected after simulating %d frames with %d words.  ",(ulong)uVar12,
              (ulong)(uint)pPars_00->nWords);
  }
  iVar16 = 3;
  iVar7 = clock_gettime(3,&local_68);
  if (iVar7 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  Abc_Print(iVar16,"%s =","Time");
  Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar14 - lVar21) / 1000000.0);
  return iVar6;
  while (uVar9 = uVar9 + 1, uVar9 != 0x20) {
LAB_0071a036:
    if ((*puVar20 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_0071a048;
  }
  uVar9 = 0xffffffff;
LAB_0071a048:
  iVar16 = uVar9 - (int)lVar21;
LAB_0071a04b:
  if (-1 < iVar16) {
    bVar22 = false;
    local_4c = (uint)uVar19;
    local_6c = iVar16;
    goto LAB_0071a067;
  }
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar8) goto LAB_0071a067;
  goto LAB_00719fbe;
}

Assistant:

int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i, RetValue = 0, iOut, iPat;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    assert( pAig->pReprs && pAig->pNexts );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_Sim2Create( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManForEachRo( p->pAig, pObj, i )
        Gia_Sim2InfoZero( p, Gia_Sim2Data(p, Gia_ObjValue(pObj)) );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_Sim2SimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            if ( pAig->pReprs && pAig->pNexts )
                Abc_Print( 1, "Lits = %4d. ", Gia_ManEquivCountLitsAll(pAig) );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_Sim2CheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_Sim2GenerateCounter( pAig, i, iOut, p->nWords, iPat );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( pAig->pReprs && pAig->pNexts )
            Gia_Sim2InfoRefineEquivs( p );
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_Sim2InfoTransfer( p );
    }
    Gia_Sim2Delete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}